

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O2

bool __thiscall slang::ast::CoverageOptionSetter::isTypeOption(CoverageOptionSetter *this)

{
  ExpressionSyntax *pEVar1;
  int *piVar2;
  bool bVar3;
  string_view __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  pEVar1 = (((this->syntax).ptr)->expr).ptr;
  if ((((pEVar1->super_SyntaxNode).kind == AssignmentExpression) &&
      (piVar2 = *(int **)&pEVar1[1].super_SyntaxNode, *piVar2 == 0x1a1)) &&
     (piVar2 = *(int **)(piVar2 + 6), *piVar2 == 0xe5)) {
    __x = parsing::Token::valueText((Token *)(piVar2 + 6));
    __y._M_str = "type_option";
    __y._M_len = 0xb;
    bVar3 = std::operator==(__x,__y);
    return bVar3;
  }
  return false;
}

Assistant:

constexpr T get() const {
        SLANG_ASSERT(ptr);
        return ptr;
    }